

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::TextFormat::Printer::PrintFieldName
          (Printer *this,Message *message,int field_index,int field_count,Reflection *reflection,
          FieldDescriptor *field,BaseTextGenerator *generator)

{
  int x;
  FastFieldValuePrinter *pFVar1;
  AlphaNum *a;
  FastFieldValuePrinter *printer;
  AlphaNum local_90;
  string local_60;
  string_view local_40;
  FieldDescriptor *local_30;
  FieldDescriptor *field_local;
  Reflection *reflection_local;
  int field_count_local;
  int field_index_local;
  Message *message_local;
  Printer *this_local;
  
  local_30 = field;
  field_local = (FieldDescriptor *)reflection;
  reflection_local._0_4_ = field_count;
  reflection_local._4_4_ = field_index;
  _field_count_local = message;
  message_local = (Message *)this;
  if ((this->use_field_number_ & 1U) == 0) {
    pFVar1 = GetFieldPrinter(this,field);
    (*pFVar1->_vptr_FastFieldValuePrinter[0xc])
              (pFVar1,_field_count_local,(ulong)reflection_local._4_4_,(ulong)(uint)reflection_local
               ,field_local,local_30,generator);
  }
  else {
    x = FieldDescriptor::number(field);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_90,x);
    absl::lts_20250127::StrCat_abi_cxx11_(&local_60,(lts_20250127 *)&local_90,a);
    local_40 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_60);
    BaseTextGenerator::PrintString(generator,local_40);
    std::__cxx11::string::~string((string *)&local_60);
  }
  return;
}

Assistant:

void TextFormat::Printer::PrintFieldName(const Message& message,
                                         int field_index, int field_count,
                                         const Reflection* reflection,
                                         const FieldDescriptor* field,
                                         BaseTextGenerator* generator) const {
  // if use_field_number_ is true, prints field number instead
  // of field name.
  if (use_field_number_) {
    generator->PrintString(absl::StrCat(field->number()));
    return;
  }

  const FastFieldValuePrinter* printer = GetFieldPrinter(field);
  printer->PrintFieldName(message, field_index, field_count, reflection, field,
                          generator);
}